

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_closed_set_normalizer.cc
# Opt level: O3

void __thiscall
s2builderutil::NormalizeClosedSetImpl::~NormalizeClosedSetImpl(NormalizeClosedSetImpl *this)

{
  std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::~vector(&this->graphs_);
  ClosedSetNormalizer::~ClosedSetNormalizer(&this->normalizer_);
  std::
  vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
  ::~vector(&this->output_layers_);
  return;
}

Assistant:

static LayerVector Create(LayerVector output_layers,
                            const ClosedSetNormalizer::Options& options) {
    using Impl = NormalizeClosedSetImpl;
    shared_ptr<Impl> impl(new Impl(std::move(output_layers), options));
    LayerVector result;
    for (int dim = 0; dim < 3; ++dim) {
      result.push_back(make_unique<DimensionLayer>(
          dim, impl->normalizer_.graph_options()[dim], impl));
    }
    return result;
  }